

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O3

void __thiscall cppcms::widgets::select_base::element::~element(element *this)

{
  _data *p_Var1;
  pointer pcVar2;
  
  p_Var1 = (this->d).ptr_;
  if (p_Var1 != (_data *)0x0) {
    operator_delete(p_Var1);
  }
  pcVar2 = (this->tr_option).plural_._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->tr_option).plural_.field_2) {
    operator_delete(pcVar2);
  }
  pcVar2 = (this->tr_option).context_._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->tr_option).context_.field_2) {
    operator_delete(pcVar2);
  }
  pcVar2 = (this->tr_option).id_._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->tr_option).id_.field_2) {
    operator_delete(pcVar2);
  }
  pcVar2 = (this->str_option)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->str_option).field_2) {
    operator_delete(pcVar2);
  }
  pcVar2 = (this->id)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->id).field_2) {
    operator_delete(pcVar2);
    return;
  }
  return;
}

Assistant:

select_base::element::~element()
{
}